

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::RemoveInventory(AActor *this,AInventory *item)

{
  bool bVar1;
  AActor *pAVar2;
  AInventory *pAVar3;
  AInventory **local_28;
  AInventory **invp;
  AInventory *inv;
  AInventory *item_local;
  AActor *this_local;
  
  if ((item != (AInventory *)0x0) &&
     (bVar1 = TObjPtr<AActor>::operator!=(&item->Owner,(AActor *)0x0), bVar1)) {
    pAVar2 = TObjPtr<AActor>::operator->(&item->Owner);
    local_28 = TObjPtr<AInventory>::operator&(&pAVar2->Inventory);
    invp = (AInventory **)*local_28;
    while (invp != (AInventory **)0x0) {
      if ((AInventory *)invp == item) {
        pAVar3 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&(item->super_AActor).Inventory)
        ;
        *local_28 = pAVar3;
        (*(item->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x32])();
        TObjPtr<AActor>::operator=(&item->Owner,(AActor *)0x0);
        TObjPtr<AInventory>::operator=(&(item->super_AActor).Inventory,(AInventory *)0x0);
        return;
      }
      local_28 = TObjPtr<AInventory>::operator&((TObjPtr<AInventory> *)(invp + 0x6e));
      invp = (AInventory **)*local_28;
    }
  }
  return;
}

Assistant:

void AActor::RemoveInventory(AInventory *item)
{
	AInventory *inv, **invp;

	if (item != NULL && item->Owner != NULL)	// can happen if the owner was destroyed by some action from an item's use state.
	{
		invp = &item->Owner->Inventory;
		for (inv = *invp; inv != NULL; invp = &inv->Inventory, inv = *invp)
		{
			if (inv == item)
			{
				*invp = item->Inventory;
				item->DetachFromOwner();
				item->Owner = NULL;
				item->Inventory = NULL;
				break;
			}
		}
	}
}